

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::base_html_input::render_input(base_html_input *this,form_context *context)

{
  ostream *poVar1;
  char *pcVar2;
  
  base_widget::auto_generate
            ((base_widget *)
             ((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-3]),context);
  poVar1 = form_context::out(context);
  if (context->widget_part_type_ != 0) {
    if (context->html_type_ == 1) {
      pcVar2 = " />";
    }
    else {
      pcVar2 = " >";
    }
    std::operator<<(poVar1,pcVar2);
    return;
  }
  poVar1 = std::operator<<(poVar1,"<input type=\"");
  poVar1 = std::operator<<(poVar1,(string *)&this->type_);
  std::operator<<(poVar1,"\" ");
  (**(code **)(*(long *)((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-3])
              + 0x48))
            ((_func_int *)
             ((long)&this->_vptr_base_html_input + (long)this->_vptr_base_html_input[-3]),context);
  (*this->_vptr_base_html_input[3])(this,context);
  return;
}

Assistant:

void base_html_input::render_input(form_context &context)
{
	auto_generate(&context);

	std::ostream &output=context.out();
	if(context.widget_part() == first_part) {
		output<<"<input type=\""<<type_<<"\" ";
		render_attributes(context);
		render_value(context);
	}
	else {
		if(context.html() ==  as_xhtml)
			output<<" />";
		else
			output<<" >";
	}
}